

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

tommy_trie_node *
trie_bucket_remove_existing
          (tommy_trie *trie,tommy_uint_t shift,tommy_trie_node **let_ptr,tommy_trie_node *remove,
          tommy_key_t key)

{
  long lVar1;
  tommy_trie *ptVar2;
  undefined1 *ptr_00;
  long in_FS_OFFSET;
  uint local_c0;
  uint local_bc;
  tommy_uint_t last;
  tommy_uint_t count;
  tommy_uint_t i;
  tommy_uint_t level;
  void *ptr;
  tommy_trie_tree *tree;
  tommy_trie_node *node;
  tommy_trie *ptStack_90;
  tommy_key_t key_local;
  tommy_trie_node *remove_local;
  tommy_trie_node **let_ptr_local;
  tommy_uint_t shift_local;
  tommy_trie *trie_local;
  tommy_trie_node **pptStack_68;
  tommy_trie_node **let_back [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  count = 0;
  remove_local = (tommy_trie_node *)let_ptr;
  let_ptr_local._4_4_ = shift;
  do {
    ptVar2 = (tommy_trie *)remove_local->next;
    if (ptVar2 == (tommy_trie *)0x0) {
      trie_local = (tommy_trie *)0x0;
LAB_00118172:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (tommy_trie_node *)trie_local;
    }
    if (((ulong)ptVar2 & 1) != 1) {
      ptStack_90 = (tommy_trie *)remove;
      if ((remove == (tommy_trie_node *)0x0) &&
         (ptStack_90 = ptVar2, *(tommy_key_t *)(ptVar2->bucket + 3) != key)) {
        trie_local = (tommy_trie *)0x0;
      }
      else {
        tommy_list_remove_existing(&remove_local->next,(tommy_node *)ptStack_90);
        if ((remove_local->next == (tommy_node_struct *)0x0) && (count != 0)) {
          do {
            count = count - 1;
            ptr_00 = &(*let_back[(ulong)count - 1])[-1].field_0x1f;
            local_bc = 0;
            local_c0 = 0;
            for (last = 0; last < 8; last = last + 1) {
              if (*(long *)(ptr_00 + (ulong)last * 8) != 0) {
                if ((*(ulong *)(ptr_00 + (ulong)last * 8) & 1) != 0) {
                  trie_local = ptStack_90;
                  goto LAB_00118172;
                }
                local_bc = local_bc + 1;
                if (1 < local_bc) {
                  trie_local = ptStack_90;
                  goto LAB_00118172;
                }
                local_c0 = last;
              }
            }
            if (local_bc != 1) {
              __assert_fail("count == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrie.c"
                            ,0xee,
                            "tommy_trie_node *trie_bucket_remove_existing(tommy_trie *, tommy_uint_t, tommy_trie_node **, tommy_trie_node *, tommy_key_t)"
                           );
            }
            *let_back[(ulong)count - 1] = *(tommy_trie_node **)(ptr_00 + (ulong)local_c0 * 8);
            tommy_allocator_free(trie->alloc,ptr_00);
            trie->node_count = trie->node_count - 1;
          } while (count != 0);
          trie_local = ptStack_90;
        }
        else {
          trie_local = ptStack_90;
        }
      }
      goto LAB_00118172;
    }
    let_back[(ulong)count - 1] = &remove_local->next;
    remove_local = (tommy_trie_node *)
                   ((long)ptVar2->bucket +
                   ((ulong)(key >> ((byte)let_ptr_local._4_4_ & 0x1f)) & 7) * 8 + -1);
    let_ptr_local._4_4_ = let_ptr_local._4_4_ - 3;
    count = count + 1;
  } while( true );
}

Assistant:

static tommy_trie_node* trie_bucket_remove_existing(tommy_trie* trie, tommy_uint_t shift, tommy_trie_node** let_ptr, tommy_trie_node* remove, tommy_key_t key)
{
	tommy_trie_node* node;
	tommy_trie_tree* tree;
	void* ptr;
	tommy_trie_node** let_back[TOMMY_TRIE_LEVEL_MAX + 1];
	tommy_uint_t level;
	tommy_uint_t i;
	tommy_uint_t count;
	tommy_uint_t last;

	level = 0;
recurse:
	ptr = *let_ptr;

	if (!ptr)
		return 0;

	if (trie_get_type(ptr) == TOMMY_TRIE_TYPE_TREE) {
		tree = trie_get_tree(ptr);

		/* save the path */
		let_back[level++] = let_ptr;

		/* go down one level */
		let_ptr = &tree->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;

		goto recurse;
	}

	node = tommy_cast(tommy_trie_node*, ptr);

	/* if the node to remove is not specified */
	if (!remove) {
		/* remove the first */
		remove = node;

		/* check if it's really the element to remove */
		if (remove->key != key)
			return 0;
	}

	tommy_list_remove_existing(let_ptr, remove);

	/* if the list is not empty, try to reduce */
	if (*let_ptr || !level)
		return remove;

reduce:
	/* go one level up */
	let_ptr = let_back[--level];

	tree = trie_get_tree(*let_ptr);

	/* check if there is only one child node */
	count = 0;
	last = 0;
	for (i = 0; i < TOMMY_TRIE_TREE_MAX; ++i) {
		if (tree->map[i]) {
			/* if we have a sub tree, we cannot reduce */
			if (trie_get_type(tree->map[i]) != TOMMY_TRIE_TYPE_NODE)
				return remove;
			/* if more than one node, we cannot reduce */
			if (++count > 1)
				return remove;
			last = i;
		}
	}

	/* here count is never 0, as we cannot have a tree with only one sub node */
	assert(count == 1);

	*let_ptr = tree->map[last];

	tommy_allocator_free(trie->alloc, tree);
	--trie->node_count;

	/* repeat until more level */
	if (level)
		goto reduce;

	return remove;
}